

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
diligent_spirv_cross::CompilerGLSL::convert_double_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  uint64_t uVar4;
  runtime_error *prVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  char *comment;
  char print_buffer [64];
  SPIRType out_type;
  SPIRType in_type;
  char (*in_stack_fffffffffffffc60) [5];
  char *local_388;
  double local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  string local_358 [2];
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  string local_2f0;
  string local_2d0;
  undefined1 *local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [32];
  undefined1 *local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined1 local_260 [8];
  undefined4 local_258;
  undefined2 local_254;
  undefined4 local_250;
  undefined1 *local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined1 local_230 [32];
  undefined1 *local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8 [32];
  undefined7 local_1d8;
  undefined4 uStack_1d1;
  undefined8 local_1cc;
  undefined8 uStack_1c4;
  undefined4 local_1bc;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b8;
  undefined **local_180;
  undefined4 local_178;
  undefined8 local_174;
  undefined8 uStack_16c;
  undefined4 local_164;
  undefined1 *local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined1 local_148 [32];
  undefined1 *local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  undefined4 local_108;
  undefined2 local_104;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined1 auStack_e0 [32];
  undefined1 *local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined1 auStack_a8 [32];
  undefined7 local_88;
  undefined4 uStack_81;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_380 = (c->m).c[col].r[row].f64;
  if ((!NAN(local_380) && !NAN(local_380)) && ABS(local_380) != INFINITY) {
    format_double_abi_cxx11_(&local_2d0,this,local_380);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    if ((this->backend).double_literal_suffix != true) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  bVar1 = (this->options).es;
  uVar3 = (this->options).version;
  uVar8 = 0x81;
  if (bVar1 != false) {
    uVar8 = 299;
  }
  if (uVar8 < uVar3) {
    local_2b0 = local_298;
    local_2d0._M_string_length._0_4_ = 0;
    local_2d0._M_dataplus._M_p = (pointer)&PTR__SPIRType_00b70cc8;
    local_2d0.field_2._12_4_ = 1;
    uStack_2a8 = 0;
    local_2a0 = 8;
    local_278 = local_260;
    uStack_270 = 0;
    local_268 = 8;
    local_258 = 0;
    local_254 = 0;
    local_250 = 8;
    local_360 = local_230;
    uStack_240 = 0;
    local_238 = 8;
    local_368 = local_1f8;
    uStack_208 = 0;
    local_200 = 8;
    local_1d8 = 0;
    uStack_1d1 = 0;
    local_1bc = 0;
    local_1cc = 0;
    uStack_1c4 = 0;
    local_1b8._M_buckets = &local_1b8._M_single_bucket;
    local_160 = local_148;
    local_178 = 0;
    local_180 = &PTR__SPIRType_00b70cc8;
    local_164 = 1;
    uStack_158 = 0;
    local_150 = 8;
    uStack_120 = 0;
    local_118 = 8;
    local_108 = 0;
    local_104 = 0;
    local_100 = 8;
    local_370 = auStack_e0;
    uStack_f0 = 0;
    local_e8 = 8;
    local_378 = auStack_a8;
    uStack_b8 = 0;
    local_b0 = 8;
    local_88 = 0;
    uStack_81 = 0;
    local_6c = 0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_7c = 0;
    uStack_74 = 0;
    local_1b8._M_bucket_count = 1;
    local_1b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1b8._M_element_count = 0;
    local_68._M_bucket_count = 1;
    local_1b8._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_1b8._M_rehash_policy._M_next_resize = 0;
    local_1b8._M_single_bucket = (__node_base_ptr)0x0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_2d0._12_8_ = 0xe00000016;
    local_174 = 0xa00000015;
    local_2d0.field_2._4_8_ = 0x100000040;
    uStack_16c = 0x100000040;
    local_248 = local_360;
    local_210 = local_368;
    local_128 = local_110;
    local_f8 = local_370;
    local_c0 = local_378;
    if (uVar3 < 0x136 && bVar1 == true) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar5,"64-bit integers not supported in ES profile before version 310.");
      *(undefined ***)prVar5 = &PTR__runtime_error_00b70ca0;
      __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar4 = (c->m).c[col].r[row].u64;
    local_358[0]._M_dataplus._M_p = (pointer)&local_358[0].field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"GL_ARB_gpu_shader_int64","");
    require_extension_internal(this,local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358[0]._M_dataplus._M_p != &local_358[0].field_2) {
      operator_delete(local_358[0]._M_dataplus._M_p);
    }
    pcVar7 = "ul";
    if ((this->backend).long_long_literal_suffix != false) {
      pcVar7 = "ull";
    }
    snprintf((char *)local_358,0x40,"0x%llx%s",uVar4,pcVar7);
    local_388 = "inf";
    if (-INFINITY < local_380) {
      if (NAN(local_380)) {
        local_388 = "nan";
      }
    }
    else {
      local_388 = "-inf";
    }
    (*(this->super_Compiler)._vptr_Compiler[0x3c])(local_310,this,&local_2d0,&local_180);
    join<std::__cxx11::string,char_const(&)[2],char(&)[64],char_const(&)[5],char_const*&,char_const(&)[5]>
              (&local_2f0,(diligent_spirv_cross *)local_310,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x82e2c3,
               (char (*) [2])local_358,(char (*) [64])" /* ",(char (*) [5])&local_388,
               (char **)" */)",in_stack_fffffffffffffc60);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if (local_310[0] != local_300) {
      operator_delete(local_310[0]);
    }
    local_180 = &PTR__SPIRType_00b70cc8;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    uStack_b8 = 0;
    if (local_c0 != local_378) {
      free(local_c0);
    }
    uStack_f0 = 0;
    if (local_f8 != local_370) {
      free(local_f8);
    }
    uStack_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    uStack_158 = 0;
    if (local_160 != local_148) {
      free(local_160);
    }
    local_2d0._M_dataplus._M_p = (pointer)&PTR__SPIRType_00b70cc8;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1b8);
    uStack_208 = 0;
    if (local_210 != local_368) {
      free(local_210);
    }
    uStack_240 = 0;
    if (local_248 != local_360) {
      free(local_248);
    }
    uStack_270 = 0;
    if (local_278 != local_260) {
      free(local_278);
    }
    uStack_2a8 = 0;
    if (local_2b0 == local_298) {
      return __return_storage_ptr__;
    }
    free(local_2b0);
    return __return_storage_ptr__;
  }
  if (bVar1 != false) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar5,"FP64 not supported in ES profile.");
LAB_007560f0:
    *(undefined ***)prVar5 = &PTR__runtime_error_00b70ca0;
    __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (uVar3 < 400) {
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d0,"GL_ARB_gpu_shader_fp64","");
    require_extension_internal(this,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
  }
  if (local_380 < INFINITY) {
    if (local_380 <= -INFINITY) {
      pcVar7 = "(-1.0 / 0.0)";
      if ((this->backend).double_literal_suffix != false) {
        pcVar7 = "(-1.0lf / 0.0lf)";
      }
      goto LAB_00755e5b;
    }
    if (!NAN(local_380)) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar5,"Cannot represent non-finite floating point constant.");
      goto LAB_007560f0;
    }
    cVar2 = (this->backend).double_literal_suffix;
    pcVar6 = "(0.0lf / 0.0lf)";
    pcVar7 = "(0.0 / 0.0)";
  }
  else {
    cVar2 = (this->backend).double_literal_suffix;
    pcVar6 = "(1.0lf / 0.0lf)";
    pcVar7 = "(1.0 / 0.0)";
  }
  if (cVar2 != '\0') {
    pcVar7 = pcVar6;
  }
LAB_00755e5b:
  ::std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar7);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::convert_double_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	double double_value = c.scalar_f64(col, row);

	if (std::isnan(double_value) || std::isinf(double_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type { OpTypeFloat };
			SPIRType in_type { OpTypeInt };
			out_type.basetype = SPIRType::Double;
			in_type.basetype = SPIRType::UInt64;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 64;
			in_type.width = 64;

			uint64_t u64_value = c.scalar_u64(col, row);

			if (options.es && options.version < 310) // GL_NV_gpu_shader5 fallback requires 310.
				SPIRV_CROSS_THROW("64-bit integers not supported in ES profile before version 310.");
			require_extension_internal("GL_ARB_gpu_shader_int64");

			char print_buffer[64];
#ifdef _WIN32
			sprintf(print_buffer, "0x%llx%s", static_cast<unsigned long long>(u64_value),
			        backend.long_long_literal_suffix ? "ull" : "ul");
#else
			snprintf(print_buffer, sizeof(print_buffer), "0x%llx%s", static_cast<unsigned long long>(u64_value),
			         backend.long_long_literal_suffix ? "ull" : "ul");
#endif

			const char *comment = "inf";
			if (double_value == -numeric_limits<double>::infinity())
				comment = "-inf";
			else if (std::isnan(double_value))
				comment = "nan";
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, " /* ", comment, " */)");
		}
		else
		{
			if (options.es)
				SPIRV_CROSS_THROW("FP64 not supported in ES profile.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader_fp64");

			if (double_value == numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(1.0lf / 0.0lf)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (double_value == -numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(-1.0lf / 0.0lf)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(double_value))
			{
				if (backend.double_literal_suffix)
					res = "(0.0lf / 0.0lf)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = format_double(double_value);
		if (backend.double_literal_suffix)
			res += "lf";
	}

	return res;
}